

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::ZConsVisitor::~ZConsVisitor(ZConsVisitor *this)

{
  ZConsVisitor *in_RDI;
  
  ~ZConsVisitor(in_RDI);
  operator_delete(in_RDI,0xe8);
  return;
}

Assistant:

ZConsVisitor::~ZConsVisitor() { delete zconsReader_; }